

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.hxx
# Opt level: O2

bool compare<double>(double *a,double *b,string *str,double epsilon)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  
  dVar1 = *a;
  dVar2 = *b;
  if (epsilon <= ABS(dVar1 - dVar2)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in ");
    poVar3 = std::operator<<(poVar3,(string *)str);
    poVar3 = std::operator<<(poVar3,":");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<double>(*a);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<double>(*b);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return ABS(dVar1 - dVar2) < epsilon;
}

Assistant:

inline bool compare(const T & a, const T & b, const std::string & str, double epsilon = 1e-12)
{
  if (fabs(a-b) >= epsilon)
  {
    std::cerr << "Error in "<< str << ":" << std::endl;
    std::cerr << a << std::endl << b << std::endl;
    return false;
  }
  return true;
}